

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::CreateString_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContext *scriptContext;
  JsRTStringArgumentAction *pJVar1;
  JavascriptString *result;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTStringArgumentAction,(TTD::NSLogEvents::EventKind)21>
                       (evt);
    result = Js::JavascriptString::NewCopyBuffer
                       ((pJVar1->StringValue).Contents,(pJVar1->StringValue).Length,scriptContext);
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTStringArgumentAction,(TTD::NSLogEvents::EventKind)21>
              (executeContext,evt,result);
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void CreateString_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTStringArgumentAction* action = GetInlineEventDataAs<JsRTStringArgumentAction, EventKind::CreateStringActionTag>(evt);

            Js::Var res = Js::JavascriptString::NewCopyBuffer(action->StringValue.Contents, action->StringValue.Length, ctx);

            JsRTActionHandleResultForReplay<JsRTStringArgumentAction, EventKind::CreateStringActionTag>(executeContext, evt, res);
        }